

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint color_tree_add(ColorTree *tree,uchar r,uchar g,uchar b,uchar a,uint index)

{
  uint uVar1;
  ColorTree *pCVar2;
  byte bVar3;
  undefined7 in_register_00000009;
  undefined3 in_register_00000011;
  undefined7 in_register_00000031;
  ulong uVar4;
  undefined3 in_register_00000081;
  uint uVar5;
  undefined1 auVar6 [16];
  
  uVar5 = 0;
  uVar4 = CONCAT71(in_register_00000031,r);
  do {
    bVar3 = (byte)uVar5;
    uVar1 = (uint)((CONCAT31(in_register_00000081,a) >> (uVar5 & 0x1f) & 1) != 0) +
            (CONCAT31(in_register_00000011,g) >> (bVar3 & 0x1f) & 1) * 4 +
            ((uint)uVar4 >> (bVar3 & 0x1f) & 1) * 8 +
            ((uint)CONCAT71(in_register_00000009,b) >> (bVar3 & 0x1f) & 1) * 2;
    pCVar2 = tree->children[uVar1];
    if (pCVar2 == (ColorTree *)0x0) {
      pCVar2 = (ColorTree *)malloc(0x88);
      tree->children[uVar1] = pCVar2;
      if (pCVar2 == (ColorTree *)0x0) {
        return 0x53;
      }
      auVar6 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(pCVar2->children + 0xc) = ZEXT1632(auVar6);
      *(undefined1 (*) [32])(pCVar2->children + 8) = ZEXT1632(auVar6);
      *(undefined1 (*) [32])(pCVar2->children + 4) = ZEXT1632(auVar6);
      *(undefined1 (*) [32])pCVar2->children = ZEXT1632(auVar6);
      pCVar2->index = -1;
      pCVar2 = tree->children[uVar1];
      uVar4 = CONCAT71(in_register_00000031,r) & 0xffffffff;
    }
    uVar5 = uVar5 + 1;
    tree = pCVar2;
  } while (uVar5 != 8);
  pCVar2->index = index;
  return 0;
}

Assistant:

static unsigned color_tree_add(ColorTree* tree,
  unsigned char r, unsigned char g, unsigned char b, unsigned char a, unsigned index) {
  int bit;
  for (bit = 0; bit < 8; ++bit) {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if (!tree->children[i]) {
      tree->children[i] = (ColorTree*)lodepng_malloc(sizeof(ColorTree));
      if (!tree->children[i]) return 83; /*alloc fail*/
      color_tree_init(tree->children[i]);
    }
    tree = tree->children[i];
  }
  tree->index = (int)index;
  return 0;
}